

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::~CreateContextExtCase(CreateContextExtCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateContextExtCase_003d8470;
  deinit(this);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&(this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_attribList).super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base((_Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                   *)&this->m_filter);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

CreateContextExtCase::~CreateContextExtCase (void)
{
	deinit();
}